

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_buf.c
# Opt level: O0

int bufs_ensure_addb(nghttp2_bufs *bufs)

{
  nghttp2_buf *buf;
  int rv;
  nghttp2_bufs *bufs_local;
  
  if ((bufs->cur->buf).end == (bufs->cur->buf).last) {
    bufs_local._4_4_ = bufs_alloc_chain(bufs);
    if (bufs_local._4_4_ == 0) {
      bufs_local._4_4_ = 0;
    }
  }
  else {
    bufs_local._4_4_ = 0;
  }
  return bufs_local._4_4_;
}

Assistant:

static int bufs_ensure_addb(nghttp2_bufs *bufs) {
  int rv;
  nghttp2_buf *buf;

  buf = &bufs->cur->buf;

  if (nghttp2_buf_avail(buf) > 0) {
    return 0;
  }

  rv = bufs_alloc_chain(bufs);
  if (rv != 0) {
    return rv;
  }

  return 0;
}